

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

ImageChannelDesc * __thiscall
pbrt::Image::GetChannelDesc
          (Image *this,
          span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          requestedChannels)

{
  ulong uVar1;
  __type _Var2;
  size_t sVar3;
  long in_RSI;
  InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_> *in_RDI;
  size_t j;
  size_t i;
  ImageChannelDesc desc;
  ImageChannelDesc *in_stack_fffffffffffffef8;
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff00;
  polymorphic_allocator<int> *this_00;
  undefined4 in_stack_ffffffffffffff18;
  value_type_conflict1 in_stack_ffffffffffffff1c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  size_type in_stack_ffffffffffffff28;
  InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_> *in_stack_ffffffffffffff30;
  polymorphic_allocator<int> local_78;
  ulong local_70;
  ulong local_68;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18;
  
  ImageChannelDesc::ImageChannelDesc((ImageChannelDesc *)in_stack_ffffffffffffff00);
  pstd::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::size(&local_18);
  InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::resize
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  local_68 = 0;
  do {
    uVar1 = local_68;
    sVar3 = pstd::
            span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::size(&local_18);
    if (sVar3 <= uVar1) {
      ImageChannelDesc::ImageChannelDesc
                ((ImageChannelDesc *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
LAB_0054ecbd:
      ImageChannelDesc::~ImageChannelDesc((ImageChannelDesc *)0x54ecca);
      return (ImageChannelDesc *)in_RDI;
    }
    local_70 = 0;
    while( true ) {
      uVar1 = local_70;
      sVar3 = InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(in_RSI + 0x10));
      if (sVar3 <= uVar1) break;
      pstd::
      span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      operator[](&local_18,local_68);
      InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](in_stack_ffffffffffffff00,(size_type)in_stack_fffffffffffffef8);
      _Var2 = std::operator==(in_stack_ffffffffffffff20,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      if (_Var2) {
        in_stack_ffffffffffffff1c = (value_type_conflict1)local_70;
        in_stack_ffffffffffffff20 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::operator[]
                       ((InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_> *)
                        in_stack_ffffffffffffff00,(size_type)in_stack_fffffffffffffef8);
        *(value_type_conflict1 *)in_stack_ffffffffffffff20 = in_stack_ffffffffffffff1c;
        break;
      }
      local_70 = local_70 + 1;
    }
    uVar1 = local_70;
    sVar3 = InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(in_RSI + 0x10));
    if (uVar1 == sVar3) {
      this_00 = &local_78;
      pstd::pmr::polymorphic_allocator<int>::polymorphic_allocator(this_00);
      InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::InlinedVector(in_RDI,this_00);
      goto LAB_0054ecbd;
    }
    local_68 = local_68 + 1;
  } while( true );
}

Assistant:

ImageChannelDesc Image::GetChannelDesc(
    pstd::span<const std::string> requestedChannels) const {
    ImageChannelDesc desc;
    desc.offset.resize(requestedChannels.size());
    for (size_t i = 0; i < requestedChannels.size(); ++i) {
        size_t j;
        for (j = 0; j < channelNames.size(); ++j)
            if (requestedChannels[i] == channelNames[j]) {
                desc.offset[i] = j;
                break;
            }
        if (j == channelNames.size())
            return {};
    }

    return desc;
}